

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O2

div_t __thiscall Refal2::CArbitraryInteger::div(CArbitraryInteger *this,int __numer,int __denom)

{
  pointer puVar1;
  div_t dVar2;
  pointer puVar3;
  pointer puVar4;
  bool bVar5;
  TCompareResult TVar6;
  div_t extraout_RAX;
  undefined4 in_register_00000034;
  CArbitraryInteger *this_00;
  CArbitraryInteger CStack_38;
  
  this_00 = (CArbitraryInteger *)CONCAT44(in_register_00000034,__numer);
  bVar5 = IsZero(this_00);
  if (bVar5) {
    __assert_fail("!operand.IsZero()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ArbitraryInteger.cpp"
                  ,0x19a,"void Refal2::CArbitraryInteger::div(CArbitraryInteger &)");
  }
  bVar5 = IsZero(this);
  if (!bVar5) {
    TVar6 = compare(this,this_00);
    if (TVar6 == CR_Great) {
      CStack_38.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      CStack_38.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
      CStack_38.isNegative = false;
      CStack_38.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      CStack_38.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      CStack_38.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ = 0;
      calculateDiv(this,this_00,&CStack_38);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::_Vector_impl_data::
      _M_swap_data((_Vector_impl_data *)this,(_Vector_impl_data *)this_00);
      puVar1 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT71(CStack_38.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._1_7_,
                             CStack_38.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._0_1_);
      puVar3 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           CStack_38.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)CONCAT71(CStack_38.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish._1_7_,
                             CStack_38.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish._0_1_);
      CStack_38.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = SUB81(puVar4,0);
      CStack_38.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ = (undefined7)((ulong)puVar4 >> 8);
      CStack_38.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = SUB81(puVar1,0);
      CStack_38.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._1_7_ = (undefined7)((ulong)puVar1 >> 8);
      CStack_38.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = puVar3;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&CStack_38);
      return extraout_RAX;
    }
    if (TVar6 != CR_Equal) {
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::_Vector_impl_data::
      _M_swap_data((_Vector_impl_data *)this,(_Vector_impl_data *)this_00);
      dVar2 = (div_t)(this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if ((div_t)(this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish != dVar2) {
        (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)dVar2;
      }
      this->isNegative = false;
      return dVar2;
    }
    puVar1 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    this->isNegative = false;
    AddDigit(this,1);
  }
  dVar2 = (div_t)(this_00->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if ((div_t)(this_00->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish != dVar2) {
    (this_00->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)dVar2;
  }
  this_00->isNegative = false;
  return dVar2;
}

Assistant:

void CArbitraryInteger::div( CArbitraryInteger& operand )
{
	assert( !operand.IsZero() );
	if( IsZero() ) {
		// 0 / ...
		operand.Zero();
	} else {
		switch( compare( operand ) ) {
			case CR_Less:
				// x / y, where x < y
				swap( operand );
				Zero();
				break;
			case CR_Equal:
				Zero();
				AddDigit( 1 );
				operand.Zero();
				break;
			case CR_Great:
			{
				// x > y > 0
				CArbitraryInteger result;
				calculateDiv( operand, result );
				swap( operand );
				swap( result );
				break;
			}
			default:
				assert( false );
				break;
		}
	}
}